

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  ExprList_item *data;
  uint uVar1;
  sqlite3 *db;
  Table *pTVar2;
  void *p;
  u8 uVar3;
  ushort uVar4;
  u32 uVar5;
  Column *p_00;
  ExprList_item *pEVar6;
  Expr *pEVar7;
  Column *pCVar8;
  byte *pKey;
  HashElem *pHVar9;
  size_t sVar10;
  ulong uVar11;
  undefined1 *puVar12;
  Column **extraout_RAX;
  Column **ppCVar13;
  uint uVar14;
  byte *pbVar15;
  byte bVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  char *zIn;
  long lVar20;
  bool bVar21;
  u32 cnt;
  Hash ht;
  uint local_80;
  uint local_7c;
  i16 *local_78;
  Column **local_70;
  Hash local_68;
  ulong local_48;
  ExprList_item *local_40;
  Column *local_38;
  
  db = pParse->db;
  local_68.htsize = 0;
  local_68.count = 0;
  local_68.first = (HashElem *)0x0;
  local_68.ht = (_ht *)0x0;
  uVar18 = 0;
  local_70 = paCol;
  if (pEList == (ExprList *)0x0) {
    p_00 = (Column *)0x0;
    uVar14 = 0;
  }
  else {
    uVar1 = pEList->nExpr;
    p_00 = (Column *)sqlite3DbMallocZero(db,(long)(int)uVar1 << 4);
    uVar14 = 0x7fff;
    if ((int)uVar1 < 0x7fff) {
      uVar14 = uVar1;
    }
  }
  *pnCol = (i16)uVar14;
  *local_70 = p_00;
  if (0 < (int)uVar14) {
    local_40 = pEList->a;
    local_48 = (ulong)uVar14;
    uVar19 = 0;
    local_7c = uVar14;
    local_78 = pnCol;
    local_38 = p_00;
    do {
      if (db->mallocFailed != '\0') goto LAB_00191a4a;
      data = local_40 + uVar19;
      zIn = data->zEName;
      if ((zIn == (char *)0x0) || (((data->fg).field_0x1 & 3) != 0)) {
        pEVar7 = data->pExpr;
        while ((pEVar7 != (Expr *)0x0 && ((pEVar7->flags & 0x82000) != 0))) {
          if ((pEVar7->flags >> 0x13 & 1) == 0) {
            pEVar6 = (ExprList_item *)&pEVar7->pLeft;
          }
          else {
            pEVar6 = ((pEVar7->x).pList)->a;
          }
          pEVar7 = pEVar6->pExpr;
        }
        for (; (pEVar7 != (Expr *)0x0 && (pEVar7->op == 0x8d)); pEVar7 = pEVar7->pRight) {
        }
        if (pEVar7->op == ';') {
          pCVar8 = (Column *)&pEVar7->u;
LAB_0019188f:
          zIn = ((anon_union_8_2_443a03b8_for_u *)&pCVar8->zCnName)->zToken;
        }
        else if (((pEVar7->op == 0xa7) && ((pEVar7->flags & 0x3000000) == 0)) &&
                (pTVar2 = (pEVar7->y).pTab, pTVar2 != (Table *)0x0)) {
          uVar4 = pEVar7->iColumn;
          if ((short)uVar4 < 0) {
            uVar4 = pTVar2->iPKey;
          }
          zIn = "rowid";
          if (-1 < (short)uVar4) {
            pCVar8 = pTVar2->aCol + uVar4;
            goto LAB_0019188f;
          }
        }
      }
      if ((zIn == (char *)0x0) || (uVar5 = sqlite3IsTrueOrFalse(zIn), uVar5 != 0)) {
        pKey = (byte *)sqlite3MPrintf(db,"column%d",(ulong)((int)uVar19 + 1));
      }
      else {
        pKey = (byte *)sqlite3DbStrDup(db,zIn);
      }
      local_80 = 0;
LAB_001918cf:
      bVar21 = pKey != (byte *)0x0;
      if (bVar21) {
        pHVar9 = findElementWithHash(&local_68,(char *)pKey,(uint *)0x0);
        if (pHVar9->data != (void *)0x0) goto code_r0x001918f7;
        p_00->zCnName = (char *)pKey;
        if ((bVar21) && (bVar16 = *pKey, bVar16 != 0)) {
          uVar3 = '\0';
          pbVar15 = pKey;
          do {
            pbVar15 = pbVar15 + 1;
            uVar3 = uVar3 + ""[bVar16];
            bVar16 = *pbVar15;
          } while (bVar16 != 0);
          goto LAB_001919bc;
        }
      }
      else {
        p_00->zCnName = (char *)0x0;
      }
      uVar3 = '\0';
LAB_001919bc:
      p_00->hName = uVar3;
      if (((data->fg).field_0x2 & 1) != 0) {
        pbVar15 = (byte *)((long)&p_00->colFlags + 1);
        *pbVar15 = *pbVar15 | 4;
      }
      if ((bVar21) &&
         (puVar12 = (undefined1 *)sqlite3HashInsert(&local_68,(char *)pKey,data),
         (ExprList_item *)puVar12 == data)) {
        sqlite3OomFault(db);
      }
      uVar19 = uVar19 + 1;
      p_00 = p_00 + 1;
    } while (uVar19 != local_48);
    uVar19 = (ulong)local_7c;
LAB_00191a4a:
    uVar18 = (uint)uVar19;
    p_00 = local_38;
    pnCol = local_78;
  }
  sqlite3HashClear(&local_68);
  ppCVar13 = extraout_RAX;
  if (db->mallocFailed != '\0') {
    if (uVar18 != 0) {
      lVar20 = 0;
      do {
        p = *(void **)((long)&p_00->zCnName + lVar20);
        if (p != (void *)0x0) {
          sqlite3DbFreeNN(db,p);
        }
        lVar20 = lVar20 + 0x10;
      } while ((ulong)uVar18 << 4 != lVar20);
    }
    if (p_00 != (Column *)0x0) {
      sqlite3DbFreeNN(db,p_00);
    }
    *local_70 = (Column *)0x0;
    *pnCol = 0;
    ppCVar13 = local_70;
  }
  return (int)ppCVar13;
code_r0x001918f7:
  if ((*(byte *)((long)pHVar9->data + 0x11) & 0x80) != 0) {
    pbVar15 = (byte *)((long)&p_00->colFlags + 1);
    *pbVar15 = *pbVar15 | 4;
  }
  sVar10 = strlen((char *)pKey);
  if ((sVar10 & 0x3fffffff) == 0) {
    uVar17 = 0;
  }
  else {
    uVar11 = (ulong)((uint)sVar10 & 0x3fffffff);
    do {
      if ((long)uVar11 < 2) {
        uVar11 = 0;
        break;
      }
      lVar20 = uVar11 - 1;
      uVar11 = uVar11 - 1;
    } while (0xfffffffffffffff5 < (ulong)pKey[lVar20] - 0x3a);
    uVar17 = (ulong)((uint)sVar10 & 0x3fffffff);
    if (pKey[uVar11 & 0xffffffff] == 0x3a) {
      uVar17 = uVar11 & 0xffffffff;
    }
  }
  local_80 = local_80 + 1;
  pKey = (byte *)sqlite3MPrintf(db,"%.*z:%u",uVar17,pKey);
  if (3 < local_80) {
    sqlite3_randomness(4,&local_80);
  }
  goto LAB_001918cf;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */
  Table *pTab;

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
    if( NEVER(nCol>32767) ) nCol = 32767;
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !db->mallocFailed; i++, pCol++){
    struct ExprList_item *pX = &pEList->a[i];
    struct ExprList_item *pCollide;
    /* Get an appropriate name for the column
    */
    if( (zName = pX->zEName)!=0 && pX->fg.eEName==ENAME_NAME ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = sqlite3ExprSkipCollateAndLikely(pX->pExpr);
      while( ALWAYS(pColExpr!=0) && pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN
       && ALWAYS( ExprUseYTab(pColExpr) )
       && ALWAYS( pColExpr->y.pTab!=0 )
      ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        pTab = pColExpr->y.pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zCnName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        assert( zName==pX->zEName );  /* pointer comparison intended */
      }
    }
    if( zName && !sqlite3IsTrueOrFalse(zName) ){
      zName = sqlite3DbStrDup(db, zName);
    }else{
      zName = sqlite3MPrintf(db,"column%d",i+1);
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && (pCollide = sqlite3HashFind(&ht, zName))!=0 ){
      if( pCollide->fg.bUsingTerm ){
        pCol->colFlags |= COLFLAG_NOEXPAND;
      }
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      if( cnt>3 ) sqlite3_randomness(sizeof(cnt), &cnt);
    }
    pCol->zCnName = zName;
    pCol->hName = sqlite3StrIHash(zName);
    if( pX->fg.bNoExpand ){
      pCol->colFlags |= COLFLAG_NOEXPAND;
    }
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pX)==pX ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zCnName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM_BKPT;
  }
  return SQLITE_OK;
}